

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

void aom_get_var_sse_sum_16x16_dual_c
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,
               uint32_t *sse16x16,uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  uint8_t *puVar19;
  int i;
  int iVar20;
  int *piVar21;
  uint8_t *puVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint32_t uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  short sVar32;
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  int local_38;
  int local_34;
  
  lVar18 = 0;
  local_38 = 0;
  local_34 = 0;
  piVar21 = &local_38;
  bVar15 = true;
  do {
    bVar16 = bVar15;
    puVar19 = src_ptr + lVar18 * 0x10;
    puVar22 = ref_ptr + lVar18 * 0x10;
    uVar27 = 0;
    iVar23 = 0;
    iVar20 = 0;
    do {
      iVar28 = 0;
      iVar29 = 0;
      iVar30 = 0;
      iVar24 = 0;
      iVar25 = 0;
      iVar26 = 0;
      lVar17 = 0;
      do {
        uVar1 = *(undefined4 *)(puVar19 + lVar17);
        uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar2._8_4_ = 0;
        auVar2._0_8_ = uVar8;
        auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar3[8] = (char)((uint)uVar1 >> 0x10);
        auVar3._0_8_ = uVar8;
        auVar3[9] = 0;
        auVar3._10_3_ = auVar2._10_3_;
        auVar10._5_8_ = 0;
        auVar10._0_5_ = auVar3._8_5_;
        auVar4[4] = (char)((uint)uVar1 >> 8);
        auVar4._0_4_ = (int)uVar8;
        auVar4[5] = 0;
        auVar4._6_7_ = SUB137(auVar10 << 0x40,6);
        uVar1 = *(undefined4 *)(puVar22 + lVar17);
        uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar9;
        auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar6[8] = (char)((uint)uVar1 >> 0x10);
        auVar6._0_8_ = uVar9;
        auVar6[9] = 0;
        auVar6._10_3_ = auVar5._10_3_;
        auVar11._5_8_ = 0;
        auVar11._0_5_ = auVar6._8_5_;
        auVar7[4] = (char)((uint)uVar1 >> 8);
        auVar7._0_4_ = (int)uVar9;
        auVar7[5] = 0;
        auVar7._6_7_ = SUB137(auVar11 << 0x40,6);
        auVar31._0_4_ = (int)uVar8 - (int)uVar9;
        auVar31._4_4_ = auVar4._4_4_ - auVar7._4_4_;
        auVar31._8_4_ = auVar3._8_4_ - auVar6._8_4_;
        auVar31._12_4_ = (uint)(uint3)(auVar2._10_3_ >> 0x10) - (uint)(uint3)(auVar5._10_3_ >> 0x10)
        ;
        iVar23 = iVar23 + auVar31._0_4_;
        iVar24 = iVar24 + auVar31._4_4_;
        iVar25 = iVar25 + auVar31._8_4_;
        iVar26 = iVar26 + auVar31._12_4_;
        auVar31 = packssdw(auVar31,auVar31);
        auVar33 = pmulhw(auVar31,auVar31);
        sVar32 = auVar31._6_2_ * auVar31._6_2_;
        iVar14 = CONCAT22(auVar33._6_2_,sVar32);
        Var13 = CONCAT64(CONCAT42(iVar14,auVar33._4_2_),
                         CONCAT22(auVar31._4_2_ * auVar31._4_2_,sVar32));
        auVar12._4_8_ = (long)((unkuint10)Var13 >> 0x10);
        auVar12._2_2_ = auVar33._2_2_;
        auVar12._0_2_ = auVar31._2_2_ * auVar31._2_2_;
        uVar27 = uVar27 + CONCAT22(auVar33._0_2_,auVar31._0_2_ * auVar31._0_2_);
        iVar28 = iVar28 + auVar12._0_4_;
        iVar29 = iVar29 + (int)((unkuint10)Var13 >> 0x10);
        iVar30 = iVar30 + iVar14;
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0x10);
      uVar27 = iVar30 + iVar28 + iVar29 + uVar27;
      iVar23 = iVar26 + iVar24 + iVar25 + iVar23;
      puVar19 = puVar19 + source_stride;
      puVar22 = puVar22 + ref_stride;
      iVar20 = iVar20 + 1;
    } while (iVar20 != 0x10);
    *piVar21 = iVar23;
    sse16x16[lVar18] = uVar27;
    lVar18 = 1;
    piVar21 = &local_34;
    bVar15 = false;
  } while (bVar16);
  *tot_sse = *tot_sse + sse16x16[1] + *sse16x16;
  *tot_sum = *tot_sum + local_34 + local_38;
  *var16x16 = *sse16x16 - (int)((ulong)((long)local_38 * (long)local_38) >> 8);
  var16x16[1] = sse16x16[1] - (int)((ulong)((long)local_34 * (long)local_34) >> 8);
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_c(const uint8_t *src_ptr, int source_stride,
                                      const uint8_t *ref_ptr, int ref_stride,
                                      uint32_t *sse16x16, unsigned int *tot_sse,
                                      int *tot_sum, uint32_t *var16x16) {
  int sum16x16[2] = { 0 };
  // Loop over two consecutive 16x16 blocks and process as one 16x32 block.
  for (int k = 0; k < 2; k++) {
    variance(src_ptr + (k * 16), source_stride, ref_ptr + (k * 16), ref_stride,
             16, 16, &sse16x16[k], &sum16x16[k]);
  }

  // Calculate variance at 16x16 level and total sse, sum of 16x32 block.
  *tot_sse += sse16x16[0] + sse16x16[1];
  *tot_sum += sum16x16[0] + sum16x16[1];
  for (int i = 0; i < 2; i++)
    var16x16[i] =
        sse16x16[i] - (uint32_t)(((int64_t)sum16x16[i] * sum16x16[i]) >> 8);
}